

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O3

void websocketpp::sha1::calc(void *src,size_t bytelength,uchar *hash)

{
  undefined4 *puVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint *unaff_R12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  uint result [5];
  uint w [80];
  uint local_198 [6];
  size_t local_180;
  uint local_178 [82];
  undefined1 auVar14 [32];
  
  auVar13 = in_ZMM4._0_16_;
  local_198[4] = 0xc3d2e1f0;
  local_180 = bytelength;
  local_198[0] = 0x67452301;
  local_198[1] = 0xefcdab89;
  local_198[2] = 0x98badcfe;
  local_198[3] = 0x10325476;
  if (bytelength < 0x40) {
    uVar11 = 0;
  }
  else {
    unaff_R12 = local_178;
    uVar11 = 0;
    do {
      uVar12 = uVar11 + 0x40;
      puVar8 = unaff_R12;
      do {
        puVar1 = (undefined4 *)((long)src + uVar11);
        uVar11 = uVar11 + 4;
        uVar2 = swap_bytes(*puVar1);
        *puVar8 = uVar2;
        puVar8 = puVar8 + 1;
      } while (uVar11 < uVar12);
      anon_unknown_1::innerHash(local_198,unaff_R12);
      auVar13 = in_ZMM4._0_16_;
    } while (uVar11 <= bytelength - 0x40);
  }
  sVar5 = local_180;
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[7] = 0;
  local_178[8] = 0;
  local_178[9] = 0;
  local_178[10] = 0;
  local_178[0xb] = 0;
  local_178[0xc] = 0;
  local_178[0xd] = 0;
  local_178[0xe] = 0;
  local_178[0xf] = 0;
  uVar6 = local_180 - uVar11;
  uVar12 = 0;
  if (uVar6 != 0) {
    uVar10 = 0;
    uVar9 = 0;
    do {
      lVar7 = uVar10 + uVar11;
      uVar12 = uVar10 & 0xfffffffffffffffc;
      uVar10 = uVar10 + 1;
      puVar8 = (uint *)((long)local_178 + uVar12);
      *puVar8 = *puVar8 | (uint)*(byte *)((long)src + lVar7) << (~(byte)uVar9 & 0x18);
      uVar12 = uVar6;
      uVar9 = (ulong)((int)uVar9 + 8);
    } while (uVar6 != uVar10);
  }
  puVar8 = (uint *)((long)local_178 + (uVar12 & 0xfffffffffffffffc));
  *puVar8 = *puVar8 | 0x80 << (~((char)uVar12 * '\b') & 0x18U);
  if (0x37 < uVar6) {
    anon_unknown_1::innerHash(local_198,local_178);
    local_178[0] = 0;
    local_178[1] = 0;
    local_178[2] = 0;
    local_178[3] = 0;
    local_178[4] = 0;
    local_178[5] = 0;
    local_178[6] = 0;
    local_178[7] = 0;
    local_178[8] = 0;
    local_178[9] = 0;
    local_178[10] = 0;
    local_178[0xb] = 0;
    local_178[0xc] = 0;
    local_178[0xd] = 0;
    local_178[0xe] = 0;
    local_178[0xf] = 0;
  }
  local_178[0xf] = (int)sVar5 << 3;
  auVar21 = ZEXT1664(auVar13);
  anon_unknown_1::innerHash(local_198,local_178);
  auVar3 = vpmovsxbd_avx2(ZEXT816(0xd0e0f1011121314));
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0xd0e0f1011121314));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar18 = vpbroadcastq_avx512f(ZEXT816(0x14));
  auVar19 = vpbroadcastq_avx512f(ZEXT816(0x3fffffff));
  auVar24._8_4_ = 0x18;
  auVar24._0_8_ = 0x1800000018;
  auVar24._12_4_ = 0x18;
  auVar24._16_4_ = 0x18;
  auVar24._20_4_ = 0x18;
  auVar24._24_4_ = 0x18;
  auVar24._28_4_ = 0x18;
  auVar20 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff8));
  auVar25._8_4_ = 0xfffffff8;
  auVar25._0_8_ = 0xfffffff8fffffff8;
  auVar25._12_4_ = 0xfffffff8;
  auVar25._16_4_ = 0xfffffff8;
  auVar25._20_4_ = 0xfffffff8;
  auVar25._24_4_ = 0xfffffff8;
  auVar25._28_4_ = 0xfffffff8;
  auVar21 = vpternlogd_avx512f(auVar21,auVar21,auVar21,0xff);
  lVar7 = 0;
  do {
    auVar22 = vpbroadcastq_avx512f();
    lVar7 = lVar7 + 8;
    auVar22 = vporq_avx512f(auVar22,auVar17);
    uVar11 = vpcmpuq_avx512f(auVar22,auVar18,1);
    auVar22 = vpaddq_avx512f(auVar16,auVar21);
    auVar16 = vpaddq_avx512f(auVar16,auVar20);
    auVar23 = vpsrlq_avx512f(auVar22,2);
    auVar14 = vpmovm2d_avx512vl(uVar11);
    auVar14 = vpshufd_avx2(auVar14,0x1b);
    vpandq_avx512f(auVar23,auVar19);
    auVar4 = vpermq_avx2(auVar14,0x4e);
    auVar14 = vpgatherqd_avx512f(*(undefined8 *)(local_198 + (long)unaff_R12));
    auVar15._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
    auVar15._0_4_ = (uint)((byte)uVar11 & 1) * auVar14._0_4_;
    auVar15._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
    auVar15._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
    auVar15._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
    auVar15._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
    auVar15._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
    auVar15._28_4_ = (uint)(byte)(uVar11 >> 7) * auVar14._28_4_;
    auVar14 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar3);
    vpmovd2m_avx512vl(auVar4);
    auVar3 = vpaddd_avx2(auVar25,auVar3);
    auVar14 = vpslld_avx2(auVar14,3);
    auVar14 = vpand_avx2(auVar14,auVar24);
    auVar14 = vpsrlvd_avx2(auVar15,auVar14);
    auVar13 = vpmovdb_avx512vl(auVar14);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar13._0_8_;
    auVar13 = vpshufb_avx(auVar26,ZEXT816(0x1020304050607));
    auVar13 = vmovdqu8_avx512vl(auVar13);
    *(undefined1 (*) [16])(hash + auVar22._0_8_ + -7) = auVar13;
  } while (lVar7 != 0x18);
  return;
}

Assistant:

inline void calc(void const * src, size_t bytelength, unsigned char * hash) {
    // Init the result array.
    unsigned int result[5] = { 0x67452301, 0xefcdab89, 0x98badcfe,
                               0x10325476, 0xc3d2e1f0 };

    // Cast the void src pointer to be the byte array we can work with.
    unsigned char const * sarray = (unsigned char const *) src;

    // The reusable round buffer
    unsigned int w[80];

    // Loop through all complete 64byte blocks.

    size_t endCurrentBlock;
    size_t currentBlock = 0;

    if (bytelength >= 64) {
        size_t const endOfFullBlocks = bytelength - 64;

        while (currentBlock <= endOfFullBlocks) {
            endCurrentBlock = currentBlock + 64;

            // Init the round buffer with the 64 byte block data.
            for (int roundPos = 0; currentBlock < endCurrentBlock; currentBlock += 4)
            {
                // This line will swap endian on big endian and keep endian on
                // little endian.
                w[roundPos++] = (unsigned int) sarray[currentBlock + 3]
                        | (((unsigned int) sarray[currentBlock + 2]) << 8)
                        | (((unsigned int) sarray[currentBlock + 1]) << 16)
                        | (((unsigned int) sarray[currentBlock]) << 24);
            }
            innerHash(result, w);
        }
    }

    // Handle the last and not full 64 byte block if existing.
    endCurrentBlock = bytelength - currentBlock;
    clearWBuffert(w);
    size_t lastBlockBytes = 0;
    for (;lastBlockBytes < endCurrentBlock; ++lastBlockBytes) {
        w[lastBlockBytes >> 2] |= (unsigned int) sarray[lastBlockBytes + currentBlock] << ((3 - (lastBlockBytes & 3)) << 3);
    }

    w[lastBlockBytes >> 2] |= 0x80 << ((3 - (lastBlockBytes & 3)) << 3);
    if (endCurrentBlock >= 56) {
        innerHash(result, w);
        clearWBuffert(w);
    }
    w[15] = bytelength << 3;
    innerHash(result, w);

    // Store hash in result pointer, and make sure we get in in the correct
    // order on both endian models.
    for (int hashByte = 20; --hashByte >= 0;) {
        hash[hashByte] = (result[hashByte >> 2] >> (((3 - hashByte) & 0x3) << 3)) & 0xff;
    }
}